

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O2

_Bool Curl_uint_hash_remove(uint_hash *h,uint id)

{
  uint_hash_entry *e;
  uint_hash_entry *puVar1;
  
  if (h->table == (uint_hash_entry **)0x0) {
    return false;
  }
  e = (uint_hash_entry *)(h->table + (ulong)id % (ulong)h->slots);
  do {
    puVar1 = e;
    e = puVar1->next;
    if (e == (uint_hash_entry *)0x0) {
      return false;
    }
  } while (e->id != id);
  puVar1->next = e->next;
  h->size = h->size - 1;
  uint_hash_entry_destroy(h,e);
  return true;
}

Assistant:

bool Curl_uint_hash_remove(struct uint_hash *h, unsigned int id)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == CURL_UINTHASHINIT);
  if(h->table) {
    struct uint_hash_entry *he, **he_anchor;

    he_anchor = CURL_UINT_HASH_SLOT_ADDR(h, id);
    while(*he_anchor) {
      he = *he_anchor;
      if(id == he->id) {
        uint_hash_entry_unlink(h, he_anchor, he);
        uint_hash_entry_destroy(h, he);
        return TRUE;
      }
      he_anchor = &he->next;
    }
  }
  return FALSE;
}